

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.h
# Opt level: O2

void __thiscall arangodb::velocypack::Builder::addUTCDate(Builder *this,int64_t v)

{
  reserve(this,9);
  appendByteUnchecked(this,'\x1c');
  appendLengthUnchecked<8ul>(this,v);
  return;
}

Assistant:

void addUTCDate(int64_t v) {
    constexpr uint8_t vSize = sizeof(int64_t);  // is always 8
    reserve(1 + vSize);
    appendByteUnchecked(0x1c);
    appendLengthUnchecked<vSize>(toUInt64(v));
  }